

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_dense.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  N_Vector v;
  N_Vector v_00;
  SUNMatrix A;
  SUNMatrix I;
  long lVar7;
  undefined8 *puVar8;
  realtype *prVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  char *__s;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  bool bVar19;
  
  if (argc < 4) {
    __s = "ERROR: THREE (3) Input required: matrix rows, matrix cols, print timing ";
  }
  else {
    lVar5 = atol(argv[1]);
    if (lVar5 < 1) {
      __s = "ERROR: number of rows must be a positive integer ";
    }
    else {
      lVar6 = atol(argv[2]);
      if (0 < lVar6) {
        iVar1 = atoi(argv[3]);
        SetTiming(iVar1);
        I = (SUNMatrix)0x0;
        printf("\nDense matrix test: size %ld by %ld\n\n",lVar5,lVar6);
        v = (N_Vector)N_VNew_Serial(lVar6);
        v_00 = (N_Vector)N_VNew_Serial(lVar5);
        A = (SUNMatrix)SUNDenseMatrix(lVar5,lVar6);
        if (lVar5 == lVar6) {
          I = (SUNMatrix)SUNDenseMatrix(lVar5,lVar6);
        }
        lVar7 = SUNDenseMatrix_Data(A);
        lVar10 = 1;
        lVar11 = 1;
        if (1 < lVar5) {
          lVar11 = lVar5;
        }
        lVar12 = 1;
        if (1 < lVar6) {
          lVar12 = lVar6;
        }
        lVar13 = 2;
        lVar14 = 0;
        lVar15 = 0;
        do {
          lVar18 = 0;
          lVar16 = lVar14;
          do {
            *(double *)(lVar7 + lVar18 * 8) = (double)lVar16;
            lVar18 = lVar18 + 1;
            lVar16 = lVar16 + lVar10;
          } while (lVar11 != lVar18);
          lVar15 = lVar15 + 1;
          lVar14 = lVar14 + lVar13;
          lVar13 = lVar13 + 2;
          lVar10 = lVar10 + 1;
          lVar7 = lVar7 + lVar5 * 8;
        } while (lVar15 != lVar12);
        if (lVar5 == lVar6) {
          puVar8 = (undefined8 *)SUNDenseMatrix_Data(I);
          lVar11 = 1;
          if (1 < lVar5) {
            lVar11 = lVar5;
          }
          do {
            *puVar8 = 0x3ff0000000000000;
            puVar8 = puVar8 + lVar5 + 1;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
        prVar9 = N_VGetArrayPointer(v);
        lVar11 = 1;
        lVar7 = 1;
        if (1 < lVar6) {
          lVar7 = lVar6;
        }
        do {
          prVar9[lVar11 + -1] = 1.0 / (double)lVar11;
          bVar19 = lVar11 != lVar7;
          lVar11 = lVar11 + 1;
        } while (bVar19);
        prVar9 = N_VGetArrayPointer(v_00);
        lVar11 = 1;
        if (1 < lVar5) {
          lVar11 = lVar5;
        }
        lVar7 = lVar6 + -1;
        lVar10 = 0;
        do {
          prVar9[lVar10] = (double)lVar7 * (double)lVar6 * 0.5;
          lVar10 = lVar10 + 1;
          lVar7 = lVar7 + 2;
        } while (lVar11 != lVar10);
        iVar1 = Test_SUNMatGetID(A,SUNMATRIX_DENSE,0);
        iVar2 = Test_SUNMatClone(A,0);
        iVar3 = Test_SUNMatCopy(A,0);
        iVar4 = Test_SUNMatZero(A,0);
        iVar1 = iVar4 + iVar3 + iVar2 + iVar1;
        if (lVar5 == lVar6) {
          iVar2 = Test_SUNMatScaleAdd(A,I,0);
          iVar3 = Test_SUNMatScaleAddI(A,I,0);
          iVar1 = iVar1 + iVar3 + iVar2;
        }
        iVar2 = Test_SUNMatMatvec(A,v,v_00,0);
        iVar3 = Test_SUNMatSpace(A,0);
        uVar17 = iVar3 + iVar2 + iVar1;
        if (uVar17 == 0) {
          puts("SUCCESS: SUNMatrix module passed all tests \n ");
        }
        else {
          printf("FAIL: SUNMatrix module failed %i tests \n \n",(ulong)uVar17);
          puts("\nA =");
          SUNDenseMatrix_Print(A,_stdout);
          if (lVar5 == lVar6) {
            puts("\nI =");
            SUNDenseMatrix_Print(I,_stdout);
          }
          puts("\nx =");
          N_VPrint_Serial(v);
          puts("\ny =");
          N_VPrint_Serial(v_00);
        }
        N_VDestroy_Serial(v);
        N_VDestroy_Serial(v_00);
        SUNMatDestroy(A);
        if (lVar5 != lVar6) {
          return uVar17;
        }
        SUNMatDestroy(I);
        return uVar17;
      }
      __s = "ERROR: number of cols must be a positive integer ";
    }
  }
  puts(__s);
  return -1;
}

Assistant:

int main(int argc, char *argv[]) 
{
  int          fails = 0;        /* counter for test failures  */
  sunindextype matrows, matcols; /* vector length              */
  N_Vector     x, y;             /* test vectors               */
  realtype     *xdata, *ydata;   /* pointers to vector data    */
  SUNMatrix    A, I;             /* test matrices              */
  realtype     *Adata, *Idata;   /* pointers to matrix data    */
  int          print_timing, square;
  sunindextype i, j, m, n;

  /* check input and set vector length */
  if (argc < 4){
    printf("ERROR: THREE (3) Input required: matrix rows, matrix cols, print timing \n");
    return(-1);
  }
  
  matrows = atol(argv[1]); 
  if (matrows <= 0) {
    printf("ERROR: number of rows must be a positive integer \n");
    return(-1); 
  }
  
  matcols = atol(argv[2]); 
  if (matcols <= 0) {
    printf("ERROR: number of cols must be a positive integer \n");
    return(-1); 
  }

  print_timing = atoi(argv[3]);
  SetTiming(print_timing);
  
  square = (matrows == matcols) ? 1 : 0;
  printf("\nDense matrix test: size %ld by %ld\n\n",
         (long int) matrows, (long int) matcols);

  /* Initialize vectors and matrices to NULL */
  x = NULL;
  y = NULL;
  A = NULL;
  I = NULL;
  
  /* Create vectors and matrices */
  x = N_VNew_Serial(matcols);
  y = N_VNew_Serial(matrows);
  A = SUNDenseMatrix(matrows, matcols);
  I = NULL;
  if (square)
    I = SUNDenseMatrix(matrows, matcols);
  
  /* Fill matrices and vectors */
  Adata = SUNDenseMatrix_Data(A);
  for(j=0; j < matcols; j++) {
    for(i=0; i < matrows; i++) {
      Adata[j*matrows + i] = (j+1)*(i+j);
    }
  }

  if (square) {
    Idata = SUNDenseMatrix_Data(I);
    for(i=0, j=0; i < matrows; i++, j++) {
      Idata[j*matrows + i] = ONE;
    }
  }

  xdata = N_VGetArrayPointer(x);
  for(i=0; i < matcols; i++) {
    xdata[i] = ONE / (i+1);
  }

  ydata = N_VGetArrayPointer(y);
  for(i=0; i < matrows; i++) {
    m = i;
    n = m + matcols - 1;
    ydata[i] = HALF*(n+1-m)*(n+m);
  }
    
  /* SUNMatrix Tests */
  fails += Test_SUNMatGetID(A, SUNMATRIX_DENSE, 0);
  fails += Test_SUNMatClone(A, 0);
  fails += Test_SUNMatCopy(A, 0);
  fails += Test_SUNMatZero(A, 0);
  if (square) {
    fails += Test_SUNMatScaleAdd(A, I, 0);
    fails += Test_SUNMatScaleAddI(A, I, 0);
  }
  fails += Test_SUNMatMatvec(A, x, y, 0);
  fails += Test_SUNMatSpace(A, 0);

  /* Print result */
  if (fails) {
    printf("FAIL: SUNMatrix module failed %i tests \n \n", fails);
    printf("\nA =\n");
    SUNDenseMatrix_Print(A,stdout);
    if (square) {
      printf("\nI =\n");
      SUNDenseMatrix_Print(I,stdout);
    }
    printf("\nx =\n");
    N_VPrint_Serial(x);
    printf("\ny =\n");
    N_VPrint_Serial(y);
  } else {
    printf("SUCCESS: SUNMatrix module passed all tests \n \n");
  }

  /* Free vectors and matrices */
  N_VDestroy_Serial(x);
  N_VDestroy_Serial(y);
  SUNMatDestroy(A);
  if (square)
    SUNMatDestroy(I);

  return(fails);
}